

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O0

ClassBuilder * __thiscall
Lodtalk::ClassBuilder::setSuperclass(ClassBuilder *this,Class *superClass,Metaclass *metaSuper)

{
  bool bVar1;
  Class *pCVar2;
  Metaclass *pMVar3;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar4;
  Metaclass *metaSuper_local;
  Class *superClass_local;
  ClassBuilder *this_local;
  
  pCVar2 = Ref<Lodtalk::Class>::operator->(&this->clazz);
  (pCVar2->super_ClassDescription).super_Behavior.superclass = (Behavior *)superClass;
  bVar1 = isNil((ProtoObject *)superClass);
  if (bVar1) {
    aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(0);
    pCVar2 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    (pCVar2->super_ClassDescription).super_Behavior.format.field_0 = aVar4;
    aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(0);
    pCVar2 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    (pCVar2->super_ClassDescription).super_Behavior.fixedVariableCount.field_0 = aVar4;
  }
  else {
    pCVar2 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    (pCVar2->super_ClassDescription).super_Behavior.format.field_0 =
         (superClass->super_ClassDescription).super_Behavior.format.field_0;
    pCVar2 = Ref<Lodtalk::Class>::operator->(&this->clazz);
    (pCVar2->super_ClassDescription).super_Behavior.fixedVariableCount.field_0 =
         (superClass->super_ClassDescription).super_Behavior.fixedVariableCount.field_0;
  }
  pMVar3 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
  (pMVar3->super_ClassDescription).super_Behavior.superclass = (Behavior *)metaSuper;
  pMVar3 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
  (pMVar3->super_ClassDescription).super_Behavior.format.field_0 =
       (metaSuper->super_ClassDescription).super_Behavior.format.field_0;
  pMVar3 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
  (pMVar3->super_ClassDescription).super_Behavior.fixedVariableCount.field_0 =
       (metaSuper->super_ClassDescription).super_Behavior.fixedVariableCount.field_0;
  bVar1 = isNil((ProtoObject *)superClass);
  if (bVar1) {
    aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(1);
    pMVar3 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
    (pMVar3->super_ClassDescription).super_Behavior.format.field_0 = aVar4;
    aVar4 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::encodeSmallInteger(0xf);
    pMVar3 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
    (pMVar3->super_ClassDescription).super_Behavior.fixedVariableCount.field_0 = aVar4;
  }
  return this;
}

Assistant:

ClassBuilder &ClassBuilder::setSuperclass(Class *superClass, Metaclass *metaSuper)
{
    // Copy the format from the super class
    clazz->superclass = superClass;
    if(!isNil(superClass))
    {
        clazz->format = superClass->format;
        clazz->fixedVariableCount = superClass->fixedVariableCount;
    }
    else
    {
        clazz->format = Oop::encodeSmallInteger(OF_EMPTY);
        clazz->fixedVariableCount = Oop::encodeSmallInteger(0);
    }

    // Set the meta class super class.
    metaclass->superclass = metaSuper;

    // Set the meta class format and fixed size
    metaclass->format = metaSuper->format;
    metaclass->fixedVariableCount = metaSuper->fixedVariableCount;
    if(isNil(superClass))
    {
        metaclass->format = Oop::encodeSmallInteger(OF_FIXED_SIZE);
        metaclass->fixedVariableCount = Oop::encodeSmallInteger(Class::ClassVariableCount);
    }

    return *this;
}